

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O1

archive * archive_read_disk_new(void)

{
  archive *a;
  archive_entry *paVar1;
  
  a = (archive *)calloc(1,0x130);
  if (a == (archive *)0x0) {
    a = (archive *)0x0;
  }
  else {
    a->magic = 0xbadb0c5;
    a->state = 1;
    if (archive_read_disk_vtable_inited == '\0') {
      archive_read_disk_vtable_av._8_8_ = _archive_read_free;
      archive_read_disk_vtable_av._0_8_ = _archive_read_close;
      archive_read_disk_vtable_av._64_8_ = _archive_read_data_block;
      archive_read_disk_vtable_av._48_8_ = _archive_read_next_header;
      archive_read_disk_vtable_av._56_8_ = _archive_read_next_header2;
      archive_read_disk_vtable_inited = '\x01';
    }
    a->vtable = (archive_vtable_conflict *)archive_read_disk_vtable_av;
    paVar1 = archive_entry_new2(a);
    *(archive_entry **)(a + 1) = paVar1;
    a[1].error_string.buffer_length = (size_t)trivial_lookup_uname;
    a[1].error = (char *)trivial_lookup_gname;
    a[1].file_count = 4;
    a[1].archive_format_name = (char *)open_on_current_dir;
    *(code **)&a[1].compression_code = tree_current_dir_fd;
    a[1].compression_name = (char *)tree_enter_working_dir;
  }
  return a;
}

Assistant:

struct archive *
archive_read_disk_new(void)
{
	struct archive_read_disk *a;

	a = (struct archive_read_disk *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_READ_DISK_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = archive_read_disk_vtable();
	a->entry = archive_entry_new2(&a->archive);
	a->lookup_uname = trivial_lookup_uname;
	a->lookup_gname = trivial_lookup_gname;
	a->flags = ARCHIVE_READDISK_MAC_COPYFILE;
	a->open_on_current_dir = open_on_current_dir;
	a->tree_current_dir_fd = tree_current_dir_fd;
	a->tree_enter_working_dir = tree_enter_working_dir;
	return (&a->archive);
}